

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameworld.cpp
# Opt level: O0

void __thiscall CGameWorld::Reset(CGameWorld *this)

{
  CGameWorld *in_RDI;
  CEntity *pEnt;
  int i;
  CEntity *local_18;
  undefined4 in_stack_fffffffffffffff0;
  int iVar1;
  
  for (iVar1 = 0; iVar1 < 5; iVar1 = iVar1 + 1) {
    local_18 = in_RDI->m_apFirstEntityTypes[iVar1];
    while (local_18 != (CEntity *)0x0) {
      in_RDI->m_pNextTraverseEntity = local_18->m_pNextTypeEntity;
      (*local_18->_vptr_CEntity[3])();
      local_18 = in_RDI->m_pNextTraverseEntity;
    }
  }
  RemoveEntities((CGameWorld *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
  GameServer(in_RDI);
  IGameController::OnReset((IGameController *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
  RemoveEntities((CGameWorld *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
  in_RDI->m_ResetRequested = false;
  return;
}

Assistant:

void CGameWorld::Reset()
{
	// reset all entities
	for(int i = 0; i < NUM_ENTTYPES; i++)
		for(CEntity *pEnt = m_apFirstEntityTypes[i]; pEnt; )
		{
			m_pNextTraverseEntity = pEnt->m_pNextTypeEntity;
			pEnt->Reset();
			pEnt = m_pNextTraverseEntity;
		}
	RemoveEntities();

	GameServer()->m_pController->OnReset();
	RemoveEntities();

	m_ResetRequested = false;
}